

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuList.c
# Opt level: O0

void Fxu_ListCubeDelLiteral(Fxu_Cube *pCube,Fxu_Lit *pLink)

{
  Fxu_ListLit *pList;
  Fxu_Lit *pLink_local;
  Fxu_Cube *pCube_local;
  
  if ((pCube->lLits).pHead == pLink) {
    (pCube->lLits).pHead = pLink->pHNext;
  }
  if ((pCube->lLits).pTail == pLink) {
    (pCube->lLits).pTail = pLink->pHPrev;
  }
  if (pLink->pHPrev != (Fxu_Lit *)0x0) {
    pLink->pHPrev->pHNext = pLink->pHNext;
  }
  if (pLink->pHNext != (Fxu_Lit *)0x0) {
    pLink->pHNext->pHPrev = pLink->pHPrev;
  }
  (pCube->lLits).nItems = (pCube->lLits).nItems + -1;
  return;
}

Assistant:

void Fxu_ListCubeDelLiteral( Fxu_Cube * pCube, Fxu_Lit * pLink )
{
	Fxu_ListLit * pList = &(pCube->lLits);
	if ( pList->pHead == pLink )
		 pList->pHead = pLink->pHNext;
	if ( pList->pTail == pLink )
		 pList->pTail = pLink->pHPrev;
	if ( pLink->pHPrev )
		 pLink->pHPrev->pHNext = pLink->pHNext;
	if ( pLink->pHNext )
		 pLink->pHNext->pHPrev = pLink->pHPrev;
	pList->nItems--;
}